

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O0

class_t * kiste::parse_class(class_t *__return_storage_ptr__,parse_context *ctx,string *line)

{
  parse_error *ppVar1;
  string local_a8;
  string local_88;
  string local_68 [39];
  undefined1 local_41;
  long local_40;
  size_type nameEnd;
  size_type nameBegin;
  string *local_20;
  string *line_local;
  parse_context *ctx_local;
  class_t *cd;
  
  local_20 = line;
  line_local = (string *)ctx;
  ctx_local = (parse_context *)__return_storage_ptr__;
  if (ctx->_class_curly_level != 0) {
    ppVar1 = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(ppVar1,"Cannot open new class here, did you forget to call $endclass?")
    ;
    __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
  }
  nameEnd = std::__cxx11::string::find_first_not_of((char *)line,0x1120de);
  if (nameEnd != 0xffffffffffffffff) {
    local_40 = std::__cxx11::string::find_first_of((char *)local_20,0x1120de);
    local_41 = 0;
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)&__return_storage_ptr__->_parent_name);
    if (local_40 == -1) {
      std::__cxx11::string::substr((ulong)local_68,(ulong)local_20);
    }
    else {
      std::__cxx11::string::substr((ulong)local_68,(ulong)local_20);
    }
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_68);
    std::__cxx11::string::~string(local_68);
    if (local_40 != -1) {
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)local_20);
      parse_parent_class(&local_88,&local_a8);
      std::__cxx11::string::operator=
                ((string *)&__return_storage_ptr__->_parent_name,(string *)&local_88);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
    }
    return __return_storage_ptr__;
  }
  ppVar1 = (parse_error *)__cxa_allocate_exception(0x10);
  parse_error::parse_error(ppVar1,"Could not find class name");
  __cxa_throw(ppVar1,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

auto parse_class(const parse_context& ctx, const std::string& line) -> class_t
  {
    if (ctx._class_curly_level)
      throw parse_error("Cannot open new class here, did you forget to call $endclass?");
    const auto nameBegin = line.find_first_not_of(" \t", std::strlen("class"));
    if (nameBegin == line.npos)
      throw parse_error("Could not find class name");
    const auto nameEnd = line.find_first_of(" \t", nameBegin);

    auto cd = class_t{};
    cd._name = (nameEnd == line.npos) ? line.substr(nameBegin)
                                      : line.substr(nameBegin, nameEnd - nameBegin);
    if (nameEnd != line.npos)
    {
      cd._parent_name = parse_parent_class(line.substr(nameEnd));
    };

    return cd;
  }